

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void stx::
     btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
     ::shift_left_inner(inner_node *left,inner_node *right,inner_node *parent,uint parentslot)

{
  int iVar1;
  uint in_ECX;
  node **in_RDX;
  node **in_RSI;
  long in_RDI;
  uint shiftnum;
  
  iVar1 = (int)((uint)*(ushort *)((long)in_RSI + 2) - (uint)*(ushort *)(in_RDI + 2)) >> 1;
  *(node **)(in_RDI + 8 + (ulong)*(ushort *)(in_RDI + 2) * 8) = in_RDX[(ulong)in_ECX + 1];
  *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + 1;
  std::copy<double*,double*>((double *)in_RSI,(double *)in_RDX,(double *)CONCAT44(in_ECX,iVar1));
  std::
  copy<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**,stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**>
            (in_RSI,in_RDX,(node **)CONCAT44(in_ECX,iVar1));
  *(short *)(in_RDI + 2) = *(short *)(in_RDI + 2) + (short)iVar1 + -1;
  in_RDX[(ulong)in_ECX + 1] = in_RSI[(ulong)(iVar1 - 1) + 1];
  std::copy<double*,double*>((double *)in_RSI,(double *)in_RDX,(double *)CONCAT44(in_ECX,iVar1));
  std::
  copy<stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**,stx::btree<double,BufferNode<double,long>*,std::pair<double,BufferNode<double,long>*>,std::less<double>,stx::btree_default_map_traits<double,BufferNode<double,long>*>,false,std::allocator<std::pair<double,BufferNode<double,long>*>>,false>::node**>
            (in_RSI,in_RDX,(node **)CONCAT44(in_ECX,iVar1));
  *(short *)((long)in_RSI + 2) = *(short *)((long)in_RSI + 2) - (short)iVar1;
  return;
}

Assistant:

static void shift_left_inner(inner_node *left, inner_node *right, inner_node *parent, unsigned int parentslot)
        {
            BTREE_ASSERT(left->level == right->level);
            BTREE_ASSERT(parent->level == left->level + 1);

            BTREE_ASSERT(left->slotuse < right->slotuse);
            BTREE_ASSERT(parent->childid[parentslot] == left);

            unsigned int shiftnum = (right->slotuse - left->slotuse) >> 1;

            BTREE_PRINT("Shifting (inner) " << shiftnum << " entries to left " << left << " from right " << right << " with common parent " << parent << ".");

            BTREE_ASSERT(left->slotuse + shiftnum < innerslotmax);

            if (selfverify)
            {
                // find the left node's slot in the parent's children and compare to parentslot

                unsigned int leftslot = 0;
                while(leftslot <= parent->slotuse && parent->childid[leftslot] != left)
                    ++leftslot;

                BTREE_ASSERT(leftslot < parent->slotuse);
                BTREE_ASSERT(parent->childid[leftslot] == left);
                BTREE_ASSERT(parent->childid[leftslot+1] == right);

                BTREE_ASSERT(leftslot == parentslot);
            }

            // copy the parent's decision slotkey and childid to the first new key on the left
            left->slotkey[left->slotuse] = parent->slotkey[parentslot];
            left->slotuse++;

            // copy the other items from the right node to the last slots in the left node.

            std::copy(right->slotkey, right->slotkey + shiftnum-1,
                      left->slotkey + left->slotuse);
            std::copy(right->childid, right->childid + shiftnum,
                      left->childid + left->slotuse);

            left->slotuse += shiftnum - 1;

            // fixup parent
            parent->slotkey[parentslot] = right->slotkey[shiftnum - 1];

            // shift all slots in the right node

            std::copy(right->slotkey + shiftnum, right->slotkey + right->slotuse,
                      right->slotkey);
            std::copy(right->childid + shiftnum, right->childid + right->slotuse+1,
                      right->childid);

            right->slotuse -= shiftnum;
        }